

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int simpleCreate(int argc,char **argv,sqlite3_tokenizer **ppTokenizer)

{
  undefined1 uVar1;
  int iVar2;
  sqlite3_tokenizer *__s;
  size_t sVar3;
  int local_38;
  int i_1;
  int iStack_2c;
  uchar ch;
  int n;
  int i;
  simple_tokenizer *t;
  sqlite3_tokenizer **ppTokenizer_local;
  char **argv_local;
  int argc_local;
  
  __s = (sqlite3_tokenizer *)sqlite3_malloc(0x88);
  if (__s == (sqlite3_tokenizer *)0x0) {
    argv_local._4_4_ = 7;
  }
  else {
    memset(__s,0,0x88);
    if (argc < 2) {
      for (local_38 = 1; local_38 < 0x80; local_38 = local_38 + 1) {
        iVar2 = fts3_isalnum(local_38);
        uVar1 = 0;
        if (iVar2 == 0) {
          uVar1 = 0xff;
        }
        *(undefined1 *)((long)&__s[1].pModule + (long)local_38) = uVar1;
      }
    }
    else {
      sVar3 = strlen(argv[1]);
      for (iStack_2c = 0; iStack_2c < (int)sVar3; iStack_2c = iStack_2c + 1) {
        if (0x7f < (byte)argv[1][iStack_2c]) {
          sqlite3_free(__s);
          return 1;
        }
        *(undefined1 *)((long)&__s[1].pModule + (ulong)(byte)argv[1][iStack_2c]) = 1;
      }
    }
    *ppTokenizer = __s;
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

static int simpleCreate(
  int argc, const char * const *argv,
  sqlite3_tokenizer **ppTokenizer
){
  simple_tokenizer *t;

  t = (simple_tokenizer *) sqlite3_malloc(sizeof(*t));
  if( t==NULL ) return SQLITE_NOMEM;
  memset(t, 0, sizeof(*t));

  /* TODO(shess) Delimiters need to remain the same from run to run,
  ** else we need to reindex.  One solution would be a meta-table to
  ** track such information in the database, then we'd only want this
  ** information on the initial create.
  */
  if( argc>1 ){
    int i, n = (int)strlen(argv[1]);
    for(i=0; i<n; i++){
      unsigned char ch = argv[1][i];
      /* We explicitly don't support UTF-8 delimiters for now. */
      if( ch>=0x80 ){
        sqlite3_free(t);
        return SQLITE_ERROR;
      }
      t->delim[ch] = 1;
    }
  } else {
    /* Mark non-alphanumeric ASCII characters as delimiters */
    int i;
    for(i=1; i<0x80; i++){
      t->delim[i] = !fts3_isalnum(i) ? -1 : 0;
    }
  }

  *ppTokenizer = &t->base;
  return SQLITE_OK;
}